

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqstdrex.cpp
# Opt level: O2

SQInteger sqstd_rex_element(SQRex *exp)

{
  char *pcVar1;
  byte bVar2;
  byte *pbVar3;
  SQRexNode *pSVar4;
  int iVar5;
  uint uVar6;
  SQInteger SVar7;
  SQInteger SVar8;
  SQInteger SVar9;
  char cVar10;
  long lVar11;
  SQRexNodeType SVar12;
  char *pcVar13;
  SQInteger c;
  long lVar14;
  uint uVar15;
  SQInteger SStack_40;
  
  pcVar13 = exp->_p;
  cVar10 = *pcVar13;
  if (cVar10 == '$') {
    exp->_p = pcVar13 + 1;
    SVar12 = 0x10a;
LAB_001270e1:
    SVar7 = sqstd_rex_newnode(exp,SVar12);
  }
  else if (cVar10 == '[') {
    exp->_p = pcVar13 + 1;
    if (pcVar13[1] == '^') {
      SVar7 = sqstd_rex_newnode(exp,0x107);
      pcVar13 = exp->_p + 1;
      exp->_p = pcVar13;
    }
    else {
      SVar7 = sqstd_rex_newnode(exp,0x105);
      pcVar13 = exp->_p;
    }
    cVar10 = *pcVar13;
    if (cVar10 == ']') {
      pcVar13 = "empty class";
      goto LAB_001273fa;
    }
    lVar11 = SVar7;
    lVar14 = -1;
    while ((cVar10 != ']' && (pcVar13 != exp->_eol))) {
      if (lVar14 == -1 || cVar10 != '-') {
        if (lVar14 == -1) {
          SVar8 = sqstd_rex_charnode(exp,1);
        }
        else {
          exp->_nodes[lVar11].next = lVar14;
          SVar8 = sqstd_rex_charnode(exp,1);
          lVar11 = lVar14;
        }
      }
      else {
        exp->_p = pcVar13 + 1;
        if (*pcVar13 == ']') {
          pcVar13 = "unfinished range";
          goto LAB_001273fa;
        }
        SVar9 = sqstd_rex_newnode(exp,0x108);
        pcVar13 = exp->_p;
        pSVar4 = exp->_nodes;
        if ((int)*pcVar13 < pSVar4[lVar14].type) {
          pcVar13 = "invalid range";
          goto LAB_001273fa;
        }
        pSVar4[SVar9].left = (long)pSVar4[lVar14].type;
        if (*pcVar13 == 0x5c) {
          pcVar1 = pcVar13 + 1;
          exp->_p = pcVar1;
          uVar6 = (int)pcVar13[1] - 0x66U >> 1;
          uVar15 = uVar6 | (uint)(((int)pcVar13[1] - 0x66U & 1) != 0) << 0x1f;
          exp->_p = pcVar13 + 2;
          pcVar13 = pcVar1;
          if ((uVar15 < 9) && ((0x1d1U >> (uVar6 & 0x1f) & 1) != 0)) {
            pcVar13 = &DAT_0012a820 + uVar15;
          }
        }
        else {
          iVar5 = isprint((int)*pcVar13);
          if (iVar5 == 0) {
            pcVar13 = "letter expected";
            goto LAB_001273fa;
          }
          exp->_p = pcVar13 + 1;
        }
        pSVar4[SVar9].right = (long)*pcVar13;
        pSVar4[lVar11].next = SVar9;
        SVar8 = -1;
        lVar11 = SVar9;
      }
      pcVar13 = exp->_p;
      cVar10 = *pcVar13;
      lVar14 = SVar8;
    }
    pSVar4 = exp->_nodes;
    if (lVar14 != -1) {
      pSVar4[lVar11].next = lVar14;
    }
    pSVar4[SVar7].left = pSVar4[SVar7].next;
    pSVar4[SVar7].next = -1;
    SStack_40 = 0x5d;
LAB_00127277:
    sqstd_rex_expect(exp,SStack_40);
  }
  else {
    if (cVar10 == '.') {
      exp->_p = pcVar13 + 1;
      SVar12 = 0x104;
      goto LAB_001270e1;
    }
    if (cVar10 == '(') {
      exp->_p = pcVar13 + 1;
      SVar12 = 0x102;
      if (pcVar13[1] == '?') {
        exp->_p = pcVar13 + 2;
        sqstd_rex_expect(exp,0x3a);
        SVar12 = 0x103;
      }
      SVar7 = sqstd_rex_newnode(exp,SVar12);
      SVar8 = sqstd_rex_list(exp);
      exp->_nodes[SVar7].left = SVar8;
      SStack_40 = 0x29;
      goto LAB_00127277;
    }
    SVar7 = sqstd_rex_charnode(exp,0);
  }
  pbVar3 = (byte *)exp->_p;
  bVar2 = *pbVar3;
  if (bVar2 == 0x7b) {
    exp->_p = (SQChar *)(pbVar3 + 1);
    if (9 < (int)(char)pbVar3[1] - 0x30U) {
      pcVar13 = "number expected";
LAB_001273fa:
      sqstd_rex_error(exp,pcVar13);
    }
    SVar8 = sqstd_rex_parsenumber(exp);
    pcVar13 = exp->_p;
    if (*pcVar13 == ',') {
      exp->_p = pcVar13 + 1;
      uVar6 = 0xffff;
      if ((int)pcVar13[1] - 0x30U < 10) {
        SVar9 = sqstd_rex_parsenumber(exp);
        uVar6 = (uint)SVar9;
      }
      sqstd_rex_expect(exp,0x7d);
    }
    else {
      if (*pcVar13 != '}') {
        pcVar13 = ", or } expected";
        goto LAB_001273fa;
      }
      exp->_p = pcVar13 + 1;
      uVar6 = (uint)SVar8;
    }
    uVar15 = (uint)SVar8 << 0x10;
    uVar6 = uVar6 & 0xffff;
  }
  else if (bVar2 == 0x2b) {
    exp->_p = (SQChar *)(pbVar3 + 1);
    uVar6 = 0xffff;
    uVar15 = 0x10000;
  }
  else {
    if (bVar2 == 0x3f) {
      exp->_p = (SQChar *)(pbVar3 + 1);
      uVar6 = 1;
    }
    else {
      SVar8 = SVar7;
      if (bVar2 != 0x2a) goto LAB_00127380;
      exp->_p = (SQChar *)(pbVar3 + 1);
      uVar6 = 0xffff;
    }
    uVar15 = 0;
  }
  SVar8 = sqstd_rex_newnode(exp,0x100);
  pSVar4 = exp->_nodes;
  pSVar4[SVar8].left = SVar7;
  pSVar4[SVar8].right = (long)(int)(uVar15 | uVar6);
  bVar2 = *exp->_p;
LAB_00127380:
  if (((0x2b < bVar2) || ((0xe0000000001U >> ((ulong)bVar2 & 0x3f) & 1) == 0)) && (bVar2 != 0x7c)) {
    SVar7 = sqstd_rex_element(exp);
    exp->_nodes[SVar8].next = SVar7;
  }
  return SVar8;
}

Assistant:

static SQInteger sqstd_rex_element(SQRex *exp)
{
    SQInteger ret = -1;
    switch(*exp->_p)
    {
    case '(': {
        SQInteger expr;
        exp->_p++;


        if(*exp->_p =='?') {
            exp->_p++;
            sqstd_rex_expect(exp,':');
            expr = sqstd_rex_newnode(exp,OP_NOCAPEXPR);
        }
        else
            expr = sqstd_rex_newnode(exp,OP_EXPR);
        SQInteger newn = sqstd_rex_list(exp);
        exp->_nodes[expr].left = newn;
        ret = expr;
        sqstd_rex_expect(exp,')');
              }
              break;
    case '[':
        exp->_p++;
        ret = sqstd_rex_class(exp);
        sqstd_rex_expect(exp,']');
        break;
    case SQREX_SYMBOL_END_OF_STRING: exp->_p++; ret = sqstd_rex_newnode(exp,OP_EOL);break;
    case SQREX_SYMBOL_ANY_CHAR: exp->_p++; ret = sqstd_rex_newnode(exp,OP_DOT);break;
    default:
        ret = sqstd_rex_charnode(exp,SQFalse);
        break;
    }


    SQBool isgreedy = SQFalse;
    unsigned short p0 = 0, p1 = 0;
    switch(*exp->_p){
        case SQREX_SYMBOL_GREEDY_ZERO_OR_MORE: p0 = 0; p1 = 0xFFFF; exp->_p++; isgreedy = SQTrue; break;
        case SQREX_SYMBOL_GREEDY_ONE_OR_MORE: p0 = 1; p1 = 0xFFFF; exp->_p++; isgreedy = SQTrue; break;
        case SQREX_SYMBOL_GREEDY_ZERO_OR_ONE: p0 = 0; p1 = 1; exp->_p++; isgreedy = SQTrue; break;
        case '{':
            exp->_p++;
            if(!isdigit(*exp->_p)) sqstd_rex_error(exp,_SC("number expected"));
            p0 = (unsigned short)sqstd_rex_parsenumber(exp);
            /*******************************/
            switch(*exp->_p) {
        case '}':
            p1 = p0; exp->_p++;
            break;
        case ',':
            exp->_p++;
            p1 = 0xFFFF;
            if(isdigit(*exp->_p)){
                p1 = (unsigned short)sqstd_rex_parsenumber(exp);
            }
            sqstd_rex_expect(exp,'}');
            break;
        default:
            sqstd_rex_error(exp,_SC(", or } expected"));
            }
            /*******************************/
            isgreedy = SQTrue;
            break;

    }
    if(isgreedy) {
        SQInteger nnode = sqstd_rex_newnode(exp,OP_GREEDY);
        exp->_nodes[nnode].left = ret;
        exp->_nodes[nnode].right = ((p0)<<16)|p1;
        ret = nnode;
    }

    if((*exp->_p != SQREX_SYMBOL_BRANCH) && (*exp->_p != ')') && (*exp->_p != SQREX_SYMBOL_GREEDY_ZERO_OR_MORE) && (*exp->_p != SQREX_SYMBOL_GREEDY_ONE_OR_MORE) && (*exp->_p != '\0')) {
        SQInteger nnode = sqstd_rex_element(exp);
        exp->_nodes[ret].next = nnode;
    }

    return ret;
}